

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall
Js::LocalObjectAddressForRegSlot::Set(LocalObjectAddressForRegSlot *this,Var updateObject)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  
  if (this->pFrame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x68e,"(pFrame)","pFrame");
    if (!bVar2) goto LAB_008b1816;
    *puVar5 = 0;
  }
  iVar3 = (*(this->super_IDiagObjectAddress)._vptr_IDiagObjectAddress[3])(this);
  if (iVar3 == 0) {
    (*this->pFrame->_vptr_DiagStackFrame[7])(this->pFrame,(ulong)this->regSlot,updateObject);
    BVar4 = 1;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x692,"(0)",
                                "Should not be able to set the value of a register in a dead zone.")
    ;
    if (!bVar2) {
LAB_008b1816:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    BVar4 = 0;
  }
  return BVar4;
}

Assistant:

BOOL LocalObjectAddressForRegSlot::Set(Var updateObject)
    {
        Assert(pFrame);

        if (IsInDeadZone())
        {
            AssertMsg(FALSE, "Should not be able to set the value of a register in a dead zone.");
            return FALSE;
        }

        pFrame->SetRegValue(regSlot, updateObject);

        return TRUE;
    }